

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::ThreadedReplayer(ThreadedReplayer *this,Options *device_opts_,Options *opts_)

{
  VkApplicationInfo *pVVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  VkPipelineCache *local_2b0;
  vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
  *local_298;
  vector<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
  *local_280;
  vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
  *local_268;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_250;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_238;
  condition_variable *local_220;
  uint *local_210;
  uint *local_1f8;
  size_t target_size;
  Options *opts__local;
  Options *device_opts__local;
  ThreadedReplayer *this_local;
  memory_order __b_13;
  memory_order __b_12;
  memory_order __b_8;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_15;
  memory_order __b_14;
  memory_order __b_11;
  memory_order __b_10;
  memory_order __b_9;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  Fossilize::StateCreatorInterface::StateCreatorInterface(&this->super_StateCreatorInterface);
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__ThreadedReplayer_004e73a0;
  Options::Options(&this->opts,opts_);
  std::
  unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
  ::unordered_map(&this->samplers);
  std::
  unordered_map<unsigned_long,_VkDescriptorSetLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayout_T_*>_>_>
  ::unordered_map(&this->layouts);
  std::
  unordered_map<unsigned_long,_VkPipelineLayout_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>_>
  ::unordered_map(&this->pipeline_layouts);
  Fossilize::ObjectCache<VkShaderModule_T_*>::ObjectCache(&this->shader_modules);
  std::
  unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
  ::unordered_map(&this->render_passes);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::unordered_map(&this->compute_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::unordered_map(&this->graphics_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::unordered_map(&this->raytracing_pipelines);
  this->compute_pipelines_cleared = 0;
  this->graphics_pipelines_cleared = 0;
  this->raytracing_pipelines_cleared = 0;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->masked_shader_modules);
  std::
  unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
  ::unordered_map(&this->shader_module_to_hash);
  std::
  unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
  ::unordered_set(&this->enqueued_shader_modules);
  this->disk_pipeline_cache = (VkPipelineCache)0x0;
  this->validation_cache = (VkValidationCacheEXT)0x0;
  this->num_worker_threads = (this->opts).num_threads;
  this->loop_count = (this->opts).loop_count;
  local_1f8 = this->queued_count;
  do {
    *local_1f8 = 0;
    local_1f8 = local_1f8 + 1;
  } while (local_1f8 != this->completed_count);
  local_210 = this->completed_count;
  do {
    *local_210 = 0;
    local_210 = local_210 + 1;
  } while (local_210 != &this->thread_initialized_count);
  this->thread_initialized_count = 0;
  std::condition_variable::condition_variable(&this->work_available_condition);
  local_220 = (condition_variable *)&this->field_0x4a0;
  do {
    std::condition_variable::condition_variable(local_220);
    local_220 = local_220 + 0x30;
  } while (local_220 != (condition_variable *)&this->thread_pool);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->thread_pool);
  std::vector<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>::
  vector(&this->per_thread_data);
  std::mutex::mutex(&this->pipeline_work_queue_mutex);
  std::mutex::mutex(&this->internal_enqueue_mutex);
  std::queue<PipelineWorkItem,std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>>::
  queue<std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>,void>
            ((queue<PipelineWorkItem,std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>>
              *)&this->pipeline_work_queue);
  std::mutex::mutex(&this->pipeline_stats_queue_mutex);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->pipeline_stats_db);
  std::mutex::mutex(&this->validation_db_mutex);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->validation_whitelist_db);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->validation_blacklist_db);
  local_238 = this->implicit_whitelist;
  do {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(local_238);
    local_238 = local_238 + 1;
  } while (local_238 !=
           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)&this->module_identifier_db_mutex);
  std::mutex::mutex(&this->module_identifier_db_mutex);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->module_identifier_db);
  std::mutex::mutex(&this->replayer_cache_mutex);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&this->replayer_cache_db);
  local_250 = this->cached_blobs;
  do {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set(local_250);
    local_250 = local_250 + 1;
  } while (local_250 !=
           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)&this->hash_lock);
  std::mutex::mutex(&this->hash_lock);
  std::
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
  ::unordered_map(&this->graphics_parents);
  std::
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
  ::unordered_map(&this->compute_parents);
  std::
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredRayTracingInfo>_>_>
  ::unordered_map(&this->raytracing_parents);
  local_268 = this->deferred_graphics;
  do {
    std::
    vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
    ::vector(local_268);
    local_268 = local_268 + 1;
  } while ((vector<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
            *)local_268 != this->deferred_compute);
  local_280 = this->deferred_compute;
  do {
    std::
    vector<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
    ::vector(local_280);
    local_280 = local_280 + 1;
  } while (local_280 !=
           (vector<ThreadedReplayer::DeferredComputeInfo,_std::allocator<ThreadedReplayer::DeferredComputeInfo>_>
            *)this->deferred_raytracing);
  local_298 = this->deferred_raytracing;
  do {
    std::
    vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
    ::vector(local_298);
    local_298 = local_298 + 1;
  } while (local_298 !=
           (vector<ThreadedReplayer::DeferredRayTracingInfo,_std::allocator<ThreadedReplayer::DeferredRayTracingInfo>_>
            *)this->memory_context_pipeline_cache);
  local_2b0 = this->memory_context_pipeline_cache;
  do {
    *local_2b0 = (VkPipelineCache)0x0;
    local_2b0 = local_2b0 + 1;
  } while ((atomic<unsigned_long> *)local_2b0 != &this->graphics_pipeline_ns);
  this->shutting_down = false;
  std::unique_ptr<Fossilize::VulkanDevice,std::default_delete<Fossilize::VulkanDevice>>::
  unique_ptr<std::default_delete<Fossilize::VulkanDevice>,void>
            ((unique_ptr<Fossilize::VulkanDevice,std::default_delete<Fossilize::VulkanDevice>> *)
             &this->device);
  this->device_was_init = false;
  (this->device_opts).features = device_opts_->features;
  bVar2 = device_opts_->want_amd_shader_info;
  bVar3 = device_opts_->null_device;
  bVar4 = device_opts_->want_pipeline_stats;
  iVar5 = device_opts_->device_index;
  pVVar1 = device_opts_->application_info;
  (this->device_opts).enable_validation = device_opts_->enable_validation;
  (this->device_opts).want_amd_shader_info = bVar2;
  (this->device_opts).null_device = bVar3;
  (this->device_opts).want_pipeline_stats = bVar4;
  (this->device_opts).device_index = iVar5;
  (this->device_opts).application_info = pVVar1;
  this->robustness = false;
  this->global_replayer = (StateReplayer *)0x0;
  this->global_database = (DatabaseInterface *)0x0;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->graphics_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->shader_module_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->shader_module_evicted_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->thread_total_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->total_idle_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->total_peak_memory).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->pipeline_cache_hits).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->pipeline_cache_misses).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->shader_module_total_compressed_size).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->shader_module_total_size).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::vector<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>::
  resize(&this->per_thread_data,(ulong)(this->num_worker_threads + 1));
  Fossilize::ObjectCache<VkShaderModule_T_*>::set_target_size
            (&this->shader_modules,(ulong)(this->opts).shader_cache_size_mb << 0x14);
  init_whitelist_db(this);
  init_blacklist_db(this);
  return;
}

Assistant:

ThreadedReplayer(const VulkanDevice::Options &device_opts_, const Options &opts_)
		: opts(opts_),
		  num_worker_threads(opts.num_threads), loop_count(opts.loop_count),
		  device_opts(device_opts_)
	{
		// Cannot use initializers for atomics.
		graphics_pipeline_ns.store(0);
		compute_pipeline_ns.store(0);
		raytracing_pipeline_ns.store(0);
		shader_module_ns.store(0);
		graphics_pipeline_count.store(0);
		compute_pipeline_count.store(0);
		raytracing_pipeline_count.store(0);
		shader_module_count.store(0);
		shader_module_evicted_count.store(0);
		thread_total_ns.store(0);
		total_idle_ns.store(0);
		total_peak_memory.store(0);
		pipeline_cache_hits.store(0);
		pipeline_cache_misses.store(0);

		shader_module_total_compressed_size.store(0);
		shader_module_total_size.store(0);
		per_thread_data.resize(num_worker_threads + 1);

		// Could potentially overflow on 32-bit.
#if ((SIZE_MAX / (1024 * 1024)) < UINT_MAX)
		size_t target_size;
		if (opts.shader_cache_size_mb <= (SIZE_MAX / (1024 * 1024)))
			target_size = size_t(opts.shader_cache_size_mb) * 1024 * 1024;
		else
			target_size = SIZE_MAX;
#else
		size_t target_size = size_t(opts.shader_cache_size_mb) * 1024 * 1024;
#endif

		shader_modules.set_target_size(target_size);
		init_whitelist_db();
		init_blacklist_db();
	}